

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

int coda_strnappend(string *out,size_t num,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  char *__s;
  undefined8 in_RCX;
  int iVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char BUF [32768];
  undefined8 local_8108;
  void **local_8100;
  undefined1 *local_80f8;
  undefined1 local_80e8 [24];
  undefined8 local_80d0;
  undefined8 local_80c8;
  undefined8 local_80c0;
  undefined8 local_80b8;
  undefined8 local_80a8;
  undefined8 local_8098;
  undefined8 local_8088;
  undefined8 local_8078;
  undefined8 local_8068;
  undefined8 local_8058;
  undefined8 local_8048;
  char local_8038 [32776];
  
  local_80f8 = local_80e8;
  if (in_AL != '\0') {
    local_80b8 = in_XMM0_Qa;
    local_80a8 = in_XMM1_Qa;
    local_8098 = in_XMM2_Qa;
    local_8088 = in_XMM3_Qa;
    local_8078 = in_XMM4_Qa;
    local_8068 = in_XMM5_Qa;
    local_8058 = in_XMM6_Qa;
    local_8048 = in_XMM7_Qa;
  }
  local_8100 = &ap[0].overflow_arg_area;
  local_8108 = 0x3000000018;
  iVar3 = (int)num;
  local_80d0 = in_RCX;
  local_80c8 = in_R8;
  local_80c0 = in_R9;
  if (num < 0x8000) {
    iVar1 = vsnprintf(local_8038,num + 1,fmt,&local_8108);
    if (iVar3 <= iVar1) {
      iVar1 = iVar3;
    }
    std::__cxx11::string::append((char *)out,(ulong)local_8038);
  }
  else {
    __s = (char *)operator_new__(num + 1);
    iVar2 = vsnprintf(__s,num + 1,fmt,&local_8108);
    iVar1 = iVar3;
    if (iVar2 < iVar3) {
      iVar1 = iVar2;
    }
    std::__cxx11::string::append((char *)out,(ulong)__s);
    operator_delete__(__s);
  }
  return iVar1;
}

Assistant:

int coda_strnappend(std::string& out, size_t num, const char* fmt, ...)
{
	va_list ap;
	va_start(ap, fmt);

	int bytes;

	if (num < BUFSZ)
	{
		char BUF [BUFSZ];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.append(BUF, bytes);
	}
	else
	{
		char* BUF = new char [num + 1];

		if ((int) num < (bytes = vsnprintf(BUF, num + 1, fmt, ap)))
		{
			bytes = num;
		}

		out.append(BUF, bytes);

		delete [] BUF;
	}

	va_end(ap);

	return bytes;
}